

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::to_function_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,TextureFunctionNameArguments *args)

{
  uint uVar1;
  MSLFormatResolution MVar2;
  SPIRType *pSVar3;
  Variant *pVVar4;
  bool bVar5;
  SPIRVariable *pSVar6;
  MSLConstexprSampler *pMVar7;
  SPIRCombinedImageSampler *pSVar8;
  long *plVar9;
  string *this_00;
  runtime_error *prVar10;
  long *plVar11;
  char *pcVar12;
  uint32_t id;
  char *pcVar13;
  uint chain;
  ulong uVar14;
  string *fname;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  chain = (args->base).img.id;
  uVar14 = (ulong)chain;
  pSVar3 = (args->base).imgtype;
  local_60 = __return_storage_ptr__;
  pSVar6 = Compiler::maybe_get_backing_variable((Compiler *)this,chain);
  if (pSVar6 == (SPIRVariable *)0x0) {
    bVar5 = false;
    pMVar7 = (MSLConstexprSampler *)0x0;
  }
  else {
    id = (pSVar6->basevariable).id;
    if (id == 0) {
      id = (pSVar6->super_IVariant).self.id;
    }
    pMVar7 = find_constexpr_sampler(this,id);
    bVar5 = Compiler::has_extended_decoration
                      ((Compiler *)this,(pSVar6->super_IVariant).self.id,
                       SPIRVCrossDecorationDynamicImageSampler);
  }
  if ((((this->msl_options).swizzle_texture_samples == true) &&
      ((args->base).is_gather == true && bVar5 == false)) &&
     ((pMVar7 == (MSLConstexprSampler *)0x0 || (pMVar7->ycbcr_conversion_enable == false)))) {
    add_spv_func_and_recompile(this,(pSVar3->image).depth + SPVFuncImplGatherSwizzle);
    this_00 = local_60;
    bVar5 = (pSVar3->image).depth;
    pcVar13 = "spvGatherSwizzle";
    if (bVar5 != false) {
      pcVar13 = "spvGatherCompareSwizzle";
    }
    pcVar12 = pcVar13 + 0x10;
    if (bVar5 != false) {
      pcVar12 = pcVar13 + 0x17;
    }
    (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_60,pcVar13,pcVar12);
  }
  else {
    if ((uVar14 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr,
       pVVar4[uVar14].type == TypeCombinedImageSampler)) {
      pSVar8 = Variant::get<spirv_cross::SPIRCombinedImageSampler>(pVVar4 + uVar14);
    }
    else {
      pSVar8 = (SPIRCombinedImageSampler *)0x0;
    }
    this_00 = local_60;
    local_58 = &local_60->field_2;
    (local_60->_M_dataplus)._M_p = (pointer)local_58;
    local_60->_M_string_length = 0;
    (local_60->field_2)._M_local_buf[0] = '\0';
    if (((pMVar7 == (MSLConstexprSampler *)0x0) || (pMVar7->ycbcr_conversion_enable != true)) ||
       (uVar1 = pMVar7->planes, bVar5 != false || uVar1 < 2)) {
      if (pSVar8 != (SPIRCombinedImageSampler *)0x0) {
        chain = (pSVar8->image).id;
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,chain,true);
      plVar9 = (long *)::std::__cxx11::string::append((char *)&local_50);
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_70 = *plVar11;
        lStack_68 = plVar9[3];
        local_80 = &local_70;
      }
      else {
        local_70 = *plVar11;
        local_80 = (long *)*plVar9;
      }
      local_78 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)this_00,(string *)&local_80);
      if (local_80 != &local_70) {
        operator_delete(local_80);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)this_00);
      if (args->has_dref != true) {
        return this_00;
      }
    }
    else {
      if ((uVar1 & 0xfffffffe) != 2) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_80 = &local_70;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,"Unhandled number of color image planes!","");
        ::std::runtime_error::runtime_error(prVar10,(string *)&local_80);
        *(undefined ***)prVar10 = &PTR__runtime_error_00357118;
        __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((pMVar7->resolution == MSL_FORMAT_RESOLUTION_444) ||
         (pMVar7->chroma_filter == MSL_SAMPLER_FILTER_NEAREST)) {
        add_spv_func_and_recompile(this,uVar1 == 2 ^ SPVFuncImplChromaReconstructNearest3Plane);
        ::std::__cxx11::string::_M_replace
                  ((ulong)this_00,0,(char *)this_00->_M_string_length,0x2f0e51);
        return this_00;
      }
      ::std::__cxx11::string::_M_replace((ulong)local_60,0,(char *)0x0,0x2f0e6d);
      MVar2 = pMVar7->resolution;
      if (MVar2 == MSL_FORMAT_RESOLUTION_422) {
        if (pMVar7->x_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
          add_spv_func_and_recompile
                    (this,pMVar7->planes == 2 ^ SPVFuncImplChromaReconstructLinear422Midpoint3Plane)
          ;
        }
        else {
          if (pMVar7->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_80 = &local_70;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_80,"Invalid chroma location.","");
            ::std::runtime_error::runtime_error(prVar10,(string *)&local_80);
            *(undefined ***)prVar10 = &PTR__runtime_error_00357118;
            __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          add_spv_func_and_recompile
                    (this,pMVar7->planes == 2 ^
                          SPVFuncImplChromaReconstructLinear422CositedEven3Plane);
        }
      }
      else {
        if (MVar2 != MSL_FORMAT_RESOLUTION_420) {
          if (MVar2 != MSL_FORMAT_RESOLUTION_444) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_80 = &local_70;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_80,"Invalid format resolution.","");
            ::std::runtime_error::runtime_error(prVar10,(string *)&local_80);
            *(undefined ***)prVar10 = &PTR__runtime_error_00357118;
            __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1f0b,
                        "virtual string spirv_cross::CompilerMSL::to_function_name(const TextureFunctionNameArguments &)"
                       );
        }
        ::std::__cxx11::string::append((char *)this_00);
        if (pMVar7->x_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
          if (pMVar7->y_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
            add_spv_func_and_recompile
                      (this,pMVar7->planes == 2 ^
                            SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint3Plane);
          }
          else {
            if (pMVar7->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_80 = &local_70;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_80,"Invalid Y chroma location.","");
              ::std::runtime_error::runtime_error(prVar10,(string *)&local_80);
              *(undefined ***)prVar10 = &PTR__runtime_error_00357118;
              __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            add_spv_func_and_recompile
                      (this,pMVar7->planes == 2 ^
                            SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven3Plane);
          }
        }
        else {
          if (pMVar7->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_80 = &local_70;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_80,"Invalid X chroma location.","");
            ::std::runtime_error::runtime_error(prVar10,(string *)&local_80);
            *(undefined ***)prVar10 = &PTR__runtime_error_00357118;
            __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (pMVar7->y_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
            add_spv_func_and_recompile
                      (this,pMVar7->planes == 2 ^
                            SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint3Plane);
          }
          else {
            if (pMVar7->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_80 = &local_70;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_80,"Invalid Y chroma location.","");
              ::std::runtime_error::runtime_error(prVar10,(string *)&local_80);
              *(undefined ***)prVar10 = &PTR__runtime_error_00357118;
              __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            add_spv_func_and_recompile
                      (this,pMVar7->planes == 2 ^
                            SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven3Plane);
          }
        }
      }
    }
    ::std::__cxx11::string::append((char *)this_00);
  }
  return this_00;
}

Assistant:

string CompilerMSL::to_function_name(const TextureFunctionNameArguments &args)
{
	VariableID img = args.base.img;
	auto &imgtype = *args.base.imgtype;

	const MSLConstexprSampler *constexpr_sampler = nullptr;
	bool is_dynamic_img_sampler = false;
	if (auto *var = maybe_get_backing_variable(img))
	{
		constexpr_sampler = find_constexpr_sampler(var->basevariable ? var->basevariable : VariableID(var->self));
		is_dynamic_img_sampler = has_extended_decoration(var->self, SPIRVCrossDecorationDynamicImageSampler);
	}

	// Special-case gather. We have to alter the component being looked up
	// in the swizzle case.
	if (msl_options.swizzle_texture_samples && args.base.is_gather && !is_dynamic_img_sampler &&
	    (!constexpr_sampler || !constexpr_sampler->ycbcr_conversion_enable))
	{
		add_spv_func_and_recompile(imgtype.image.depth ? SPVFuncImplGatherCompareSwizzle : SPVFuncImplGatherSwizzle);
		return imgtype.image.depth ? "spvGatherCompareSwizzle" : "spvGatherSwizzle";
	}

	auto *combined = maybe_get<SPIRCombinedImageSampler>(img);

	// Texture reference
	string fname;
	if (needs_chroma_reconstruction(constexpr_sampler) && !is_dynamic_img_sampler)
	{
		if (constexpr_sampler->planes != 2 && constexpr_sampler->planes != 3)
			SPIRV_CROSS_THROW("Unhandled number of color image planes!");
		// 444 images aren't downsampled, so we don't need to do linear filtering.
		if (constexpr_sampler->resolution == MSL_FORMAT_RESOLUTION_444 ||
		    constexpr_sampler->chroma_filter == MSL_SAMPLER_FILTER_NEAREST)
		{
			if (constexpr_sampler->planes == 2)
				add_spv_func_and_recompile(SPVFuncImplChromaReconstructNearest2Plane);
			else
				add_spv_func_and_recompile(SPVFuncImplChromaReconstructNearest3Plane);
			fname = "spvChromaReconstructNearest";
		}
		else // Linear with a downsampled format
		{
			fname = "spvChromaReconstructLinear";
			switch (constexpr_sampler->resolution)
			{
			case MSL_FORMAT_RESOLUTION_444:
				assert(false);
				break; // not reached
			case MSL_FORMAT_RESOLUTION_422:
				switch (constexpr_sampler->x_chroma_offset)
				{
				case MSL_CHROMA_LOCATION_COSITED_EVEN:
					if (constexpr_sampler->planes == 2)
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422CositedEven2Plane);
					else
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422CositedEven3Plane);
					fname += "422CositedEven";
					break;
				case MSL_CHROMA_LOCATION_MIDPOINT:
					if (constexpr_sampler->planes == 2)
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422Midpoint2Plane);
					else
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422Midpoint3Plane);
					fname += "422Midpoint";
					break;
				default:
					SPIRV_CROSS_THROW("Invalid chroma location.");
				}
				break;
			case MSL_FORMAT_RESOLUTION_420:
				fname += "420";
				switch (constexpr_sampler->x_chroma_offset)
				{
				case MSL_CHROMA_LOCATION_COSITED_EVEN:
					switch (constexpr_sampler->y_chroma_offset)
					{
					case MSL_CHROMA_LOCATION_COSITED_EVEN:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven2Plane);
						else
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven3Plane);
						fname += "XCositedEvenYCositedEven";
						break;
					case MSL_CHROMA_LOCATION_MIDPOINT:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint2Plane);
						else
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint3Plane);
						fname += "XCositedEvenYMidpoint";
						break;
					default:
						SPIRV_CROSS_THROW("Invalid Y chroma location.");
					}
					break;
				case MSL_CHROMA_LOCATION_MIDPOINT:
					switch (constexpr_sampler->y_chroma_offset)
					{
					case MSL_CHROMA_LOCATION_COSITED_EVEN:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven2Plane);
						else
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven3Plane);
						fname += "XMidpointYCositedEven";
						break;
					case MSL_CHROMA_LOCATION_MIDPOINT:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint2Plane);
						else
							add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint3Plane);
						fname += "XMidpointYMidpoint";
						break;
					default:
						SPIRV_CROSS_THROW("Invalid Y chroma location.");
					}
					break;
				default:
					SPIRV_CROSS_THROW("Invalid X chroma location.");
				}
				break;
			default:
				SPIRV_CROSS_THROW("Invalid format resolution.");
			}
		}
	}
	else
	{
		fname = to_expression(combined ? combined->image : img) + ".";

		// Texture function and sampler
		if (args.base.is_fetch)
			fname += "read";
		else if (args.base.is_gather)
			fname += "gather";
		else
			fname += "sample";

		if (args.has_dref)
			fname += "_compare";
	}

	return fname;
}